

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsSetObjectBeforeCollectCallback
          (JsRef ref,void *callbackState,JsObjectBeforeCollectCallback objectBeforeCollectCallback)

{
  anon_class_24_3_9c337545 fn;
  anon_class_40_5_152d28e2 fn_00;
  bool bVar1;
  void **in_stack_ffffffffffffff70;
  ThreadContext **in_stack_ffffffffffffff80;
  Recycler *recycler;
  ThreadContext *threadContext;
  JsObjectBeforeCollectCallback *local_38;
  JsObjectBeforeCollectCallback *local_30;
  JsObjectBeforeCollectCallback local_28;
  JsObjectBeforeCollectCallback objectBeforeCollectCallback_local;
  void *callbackState_local;
  JsRef ref_local;
  
  if (ref == (JsRef)0x0) {
    ref_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    local_28 = objectBeforeCollectCallback;
    objectBeforeCollectCallback_local = (JsObjectBeforeCollectCallback)callbackState;
    callbackState_local = ref;
    bVar1 = Js::TaggedNumber::Is(ref);
    if (bVar1) {
      ref_local._4_4_ = JsErrorInvalidArgument;
    }
    else {
      bVar1 = JsrtContext::Is(callbackState_local);
      if (bVar1) {
        threadContext = (ThreadContext *)&callbackState_local;
        local_38 = &local_28;
        local_30 = &objectBeforeCollectCallback_local;
        fn.objectBeforeCollectCallback = local_30;
        fn.ref = local_38;
        fn.callbackState = in_stack_ffffffffffffff70;
        ref_local._4_4_ = GlobalAPIWrapper_NoRecord<JsSetObjectBeforeCollectCallback::__0>(fn);
      }
      else {
        recycler = (Recycler *)ThreadContext::GetContextForCurrentThread();
        if (recycler == (Recycler *)0x0) {
          ref_local._4_4_ = JsErrorNoCurrentContext;
        }
        else {
          ThreadContext::GetRecycler((ThreadContext *)recycler);
          fn_00.ref = &local_28;
          fn_00.recycler = (Recycler **)&callbackState_local;
          fn_00.objectBeforeCollectCallback = &objectBeforeCollectCallback_local;
          fn_00.callbackState = &recycler;
          fn_00.threadContext = in_stack_ffffffffffffff80;
          ref_local._4_4_ = GlobalAPIWrapper_NoRecord<JsSetObjectBeforeCollectCallback::__1>(fn_00);
        }
      }
    }
  }
  return ref_local._4_4_;
}

Assistant:

CHAKRA_API JsSetObjectBeforeCollectCallback(_In_ JsRef ref, _In_opt_ void *callbackState, _In_ JsObjectBeforeCollectCallback objectBeforeCollectCallback)
{
    VALIDATE_JSREF(ref);

    if (Js::TaggedNumber::Is(ref))
    {
        return JsErrorInvalidArgument;
    }

    if (JsrtContext::Is(ref))
    {
        return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            ThreadContext* threadContext = static_cast<JsrtContext *>(ref)->GetRuntime()->GetThreadContext();
            Recycler * recycler = threadContext->GetRecycler();
            recycler->SetObjectBeforeCollectCallback(ref, reinterpret_cast<Recycler::ObjectBeforeCollectCallback>(objectBeforeCollectCallback), callbackState,
                reinterpret_cast<Recycler::ObjectBeforeCollectCallbackWrapper>(JsrtCallbackState::ObjectBeforeCallectCallbackWrapper), threadContext);
            return JsNoError;
        });
    }
    else
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }
        Recycler * recycler = threadContext->GetRecycler();
        return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            if (!recycler->IsValidObject(ref))
            {
                return JsErrorInvalidArgument;
            }

            recycler->SetObjectBeforeCollectCallback(ref, reinterpret_cast<Recycler::ObjectBeforeCollectCallback>(objectBeforeCollectCallback), callbackState,
                reinterpret_cast<Recycler::ObjectBeforeCollectCallbackWrapper>(JsrtCallbackState::ObjectBeforeCallectCallbackWrapper), threadContext);
            return JsNoError;
        });
    }
}